

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O1

int ffgsky(fitsfile *fptr,char *keyname,int firstchar,int maxchar,char *value,int *valuelen,
          char *comm,int *status)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  bool bVar6;
  char valstring [71];
  char nextcomm [73];
  char card [81];
  uint local_154;
  int local_14c;
  char *local_148;
  int local_140;
  int local_13c;
  size_t local_138;
  char *local_130;
  char local_128 [80];
  char local_d8 [80];
  char local_88 [88];
  
  local_14c = 0;
  iVar2 = *status;
  if (iVar2 < 1) {
    *value = '\0';
    if (valuelen != (int *)0x0) {
      *valuelen = 0;
    }
    local_88[0] = '\0';
    if (comm != (char *)0x0) {
      *comm = '\0';
    }
    ffgcrd(fptr,keyname,local_88,status);
    iVar2 = *status;
    if (iVar2 < 1) {
      local_140 = maxchar;
      local_13c = firstchar;
      sVar3 = strlen(local_88);
      bVar6 = sVar3 < 0x50;
      ffpsvc(local_88,local_128,comm,status);
      iVar2 = *status;
      if (iVar2 < 1) {
        if (comm == (char *)0x0) {
          local_154 = 0;
        }
        else {
          sVar3 = strlen(comm);
          local_154 = 0x48 - (int)sVar3;
        }
        if (local_128[0] == '\0') {
          pcVar4 = (char *)malloc(1);
          *pcVar4 = '\0';
        }
        else {
          sVar3 = strlen(local_128);
          pcVar4 = (char *)malloc(sVar3 + 1);
          ffc2s(local_128,pcVar4,status);
          sVar3 = strlen(pcVar4);
          local_130 = value;
          do {
            if (0 < *status) break;
            bVar1 = true;
            if ((sVar3 != 0) && (pcVar4[sVar3 - 1] == '&')) {
              local_128[0] = '\0';
              local_d8[0] = '\0';
              local_148 = pcVar4;
              ffgcnt(fptr,local_128,local_d8,status);
              pcVar4 = local_148;
              if (local_d8[0] != '\0' || local_128[0] != '\0') {
                local_148[sVar3 - 1] = '\0';
                if (local_128[0] != '\0') {
                  sVar5 = strlen(local_128);
                  local_138 = (sVar5 + sVar3) - 1;
                  local_148 = (char *)realloc(pcVar4,sVar3 + sVar5);
                  strcat(local_148,local_128);
                  sVar3 = local_138;
                }
                if ((local_d8[0] != '\0') && (0 < (int)local_154)) {
                  if ((*comm != '\0') && (bVar6)) {
                    sVar5 = strlen(comm);
                    (comm + sVar5)[0] = ' ';
                    (comm + sVar5)[1] = '\0';
                    local_154 = local_154 - 1;
                  }
                  strncat(comm,local_d8,(ulong)local_154);
                  sVar5 = strlen(comm);
                  local_154 = 0x48 - (int)sVar5;
                }
                bVar1 = false;
                ffghps(fptr,(int *)0x0,&local_14c,status);
                ffgrec(fptr,local_14c + -1,local_88,status);
                sVar5 = strlen(local_88);
                bVar6 = sVar5 < 0x50;
                pcVar4 = local_148;
                value = local_130;
              }
            }
          } while (!bVar1);
        }
        if (pcVar4 != (char *)0x0) {
          sVar3 = strlen(pcVar4);
          if ((ulong)(long)local_13c <= sVar3) {
            strncat(value,pcVar4 + ((long)local_13c - 1),(long)local_140);
          }
          free(pcVar4);
          if (valuelen != (int *)0x0) {
            *valuelen = (int)sVar3;
          }
        }
        iVar2 = *status;
      }
    }
  }
  return iVar2;
}

Assistant:

int ffgsky( fitsfile *fptr,     /* I - FITS file pointer             */
           const char *keyname, /* I - name of keyword to read       */
           int firstchar,       /* I - first character of string to return */
           int maxchar,         /* I - maximum length of string to return */
	                        /*    (string will be null terminated)  */      
           char *value,         /* O - pointer to keyword value      */
           int *valuelen,       /* O - total length of the keyword value string */
                                /*     The returned 'value' string may only */
				/*     contain a piece of the total string, depending */
				/*     on the value of firstchar and maxchar */
           char *comm,          /* O - keyword comment (may be NULL) */
           int  *status)        /* IO - error status                 */
/*
  Read and return the value of the specified string-valued keyword.
  
  This new routine was added in 2016 to provide a more convenient user
  interface than the older ffgkls routine.

  Read a string keyword, returning up to 'naxchars' characters of the value
  starting with the 'firstchar' character.
  The input 'value' string must be allocated at least 1 char bigger to
  allow for the terminating null character.
  
  This routine may be used to read continued string keywords that use 
  the CONTINUE keyword convention, as well as normal string keywords
  that are contained within a single header record.
  
  This routine differs from the ffkls routine in that it does not
  internally allocate memory for the returned value string, and consequently
  the calling routine does not need to call fffree to free the memory.
*/
{
    char valstring[FLEN_VALUE], nextcomm[FLEN_COMMENT], card[FLEN_CARD];
    char *tempstring;
    int contin, commSpace = 0, addCommDelim=0, keynum=0;
    size_t len;

    if (*status > 0)
        return(*status);

    tempstring = NULL;  /* initialize in case of error */
    *value = '\0';
    if (valuelen) *valuelen = 0;
    
    card[0] = '\0';
    if (comm)
       comm[0] = '\0';
    ffgcrd(fptr, keyname, card, status);
    if (*status > 0)
       return(*status);
    if (strlen(card) < FLEN_CARD-1)
       addCommDelim=1;
    ffpsvc(card,valstring, comm, status);    
    if (*status > 0)
        return(*status);

    if (comm)
    {
        /* remaining space in comment string */
        commSpace = FLEN_COMMENT-1 - strlen(comm);
    }
    
    if (!valstring[0])   /* null value string? */
    {
      tempstring = (char *) malloc(1);  /* allocate and return a null string */
      *tempstring = '\0';
    }
    else
    {
      /* allocate space,  plus 1 for null */
      tempstring = (char *) malloc(strlen(valstring) + 1);

      ffc2s(valstring, tempstring, status);   /* convert string to value */
      len = strlen(tempstring);

      /* If last character is a & then value may be continued on next keyword */
      contin = 1;
      while (contin && *status <= 0)  
      {
        if (len && *(tempstring+len-1) == '&')  /*  is last char an ampersand?  */
        {
            valstring[0] = '\0';
            nextcomm[0] = '\0';
            ffgcnt(fptr, valstring, nextcomm, status);
            if (*valstring || *nextcomm)  /* If either valstring or nextcom
                                  is filled, this must be a CONTINUE line */  
            {
               *(tempstring+len-1) = '\0';         /* erase the trailing & char */
               if (*valstring)
               {
                  len += strlen(valstring) - 1;
                  tempstring = (char *) realloc(tempstring, len + 1); /* increase size */
                  strcat(tempstring, valstring);     /* append the continued chars */
               }
               if (*nextcomm)
               {
	          if ((commSpace > 0) && (*nextcomm != 0)) 
	          {
                     /* If in here, input 'comm' cannot be 0 */
                     /* concantenate comment strings (if any) */
                     if (strlen(comm) && addCommDelim)
                     {
                        strcat(comm, " ");
                        commSpace -=1;
                     }
		     strncat(comm, nextcomm, commSpace);
                     commSpace = FLEN_COMMENT-1 - strlen(comm);
                  }
               }
               /* Determine if a space delimiter is needed for next
                  comment concatenation (if any).  Assume it is if card length
                  of the most recently read keyword is less than max. 
                  keynum is 1-based. */
               ffghps(fptr,0,&keynum,status);
               ffgrec(fptr, keynum-1, card, status);
               addCommDelim = (strlen(card) < FLEN_CARD-1) ? 1 : 0;
            }
            else
	    {
                contin = 0;
            }
        }
        else
	{
            contin = 0;
	}
      }
    }
    
    if (tempstring) 
    {
        len = strlen(tempstring);
	if (firstchar <= len)
            strncat(value, tempstring + (firstchar - 1), maxchar);
        free(tempstring);
	if (valuelen) *valuelen = len;  /* total length of the keyword value */
    }
    
    return(*status);
}